

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_const_value
          (t_rs_generator *this,t_type *ttype,t_const_value *tvalue,bool is_owned)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  int64_t iVar6;
  ofstream_with_content_based_conditional_update *poVar7;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var_00;
  t_const_value *extraout_RDX;
  t_const_value *extraout_RDX_00;
  t_const_value *ptVar8;
  ulong uVar9;
  char *pcVar10;
  undefined1 auVar11 [12];
  string local_70;
  string local_50;
  
  do {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar4 != '\0') {
      switch(*(undefined4 *)&ttype[1].super_t_doc._vptr_t_doc) {
      case 1:
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
        poVar7 = &this->f_gen_;
        if ((char)iVar4 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\"",1);
          pcVar3 = (tvalue->stringVal_)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + (tvalue->stringVal_)._M_string_length);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar7,local_70._M_dataplus._M_p,local_70._M_string_length)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((is_owned & 1U) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,".to_owned()",0xb);
          }
        }
        else {
          if ((is_owned & 1U) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"b\"",2);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar3 = (tvalue->stringVal_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar3,pcVar3 + (tvalue->stringVal_)._M_string_length);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar7,local_70._M_dataplus._M_p,
                                local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\"",1);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar3 = (tvalue->stringVal_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar3,pcVar3 + (tvalue->stringVal_)._M_string_length);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar7,local_70._M_dataplus._M_p,
                                local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,".to_owned().into_bytes()",0x18);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_003305d7:
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        return;
      case 2:
        poVar7 = &this->f_gen_;
        iVar6 = t_const_value::get_integer(tvalue);
        pcVar10 = "true";
        if (iVar6 == 0) {
          pcVar10 = "false";
        }
        uVar9 = (ulong)(iVar6 == 0) | 4;
        break;
      case 3:
      case 4:
      case 5:
      case 6:
        t_const_value::get_integer(tvalue);
        std::ostream::_M_insert<long>((long)&this->f_gen_);
        return;
      case 7:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->f_gen_,"OrderedFloat::from(",0x13);
        poVar7 = (ofstream_with_content_based_conditional_update *)
                 std::ostream::_M_insert<double>(tvalue->doubleVal_);
        pcVar10 = "_f64)";
        uVar9 = 5;
        break;
      default:
        auVar11 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_
                  (&local_70,(t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc,
                   auVar11._8_4_);
        std::operator+(auVar11._0_8_,"cannot generate const value for ",&local_70);
        __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,pcVar10,uVar9);
      return;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        ptVar8 = extraout_RDX;
        if (((char)iVar4 != '\0') ||
           (iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), ptVar8 = extraout_RDX_00,
           (char)iVar4 != '\0')) {
          render_const_struct(this,ttype,ptVar8);
          return;
        }
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
        if ((char)iVar4 == '\0') {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
          std::operator+(__return_storage_ptr__,"cannot generate const value for ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar4));
LAB_00330660:
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_70._M_dataplus._M_p,
                            local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar4 == '\0') {
          iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
          if ((char)iVar4 == '\0') {
            iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
            if ((char)iVar4 == '\0') {
              __return_storage_ptr__ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
              iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
              std::operator+(__return_storage_ptr__,"cannot generate const container value for ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar4));
              goto LAB_00330660;
            }
            render_const_map(this,ttype,tvalue);
          }
          else {
            render_const_set(this,ttype,tvalue);
          }
        }
        else {
          render_const_list(this,ttype,tvalue);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_gen_,local_70._M_dataplus._M_p,
                            local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return;
        }
      }
      else {
        poVar7 = &this->f_gen_;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        paVar2 = &local_70.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
        to_rust_type_abi_cxx11_(&local_50,this,ttype);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::try_from(",0xb);
        t_const_value::get_integer(tvalue);
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,").expect(\"expecting valid const value\")",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar2) {
          return;
        }
      }
      goto LAB_003305d7;
    }
    ttype = t_type::get_true_type(ttype);
    is_owned = true;
  } while( true );
}

Assistant:

void t_rs_generator::render_const_value(t_type* ttype, t_const_value* tvalue, bool is_owned) {
  if (ttype->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)ttype;
    switch (tbase_type->get_base()) {
    case t_base_type::TYPE_STRING:
      if (tbase_type->is_binary()) {
        if (is_owned) {
          f_gen_ << "\"" << tvalue->get_string() << "\""<<  ".to_owned().into_bytes()";
        } else {
          f_gen_ << "b\"" << tvalue->get_string() << "\"";
        }
      } else {
        f_gen_ << "\"" << tvalue->get_string() << "\"";
        if (is_owned) {
          f_gen_ << ".to_owned()";
        }
      }
      break;
    case t_base_type::TYPE_BOOL:
      f_gen_ << (tvalue->get_integer() ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      f_gen_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      f_gen_ << "OrderedFloat::from(" << tvalue->get_double() << "_f64)";
      break;
    default:
      throw "cannot generate const value for " + t_base_type::t_base_name(tbase_type->get_base());
    }
  } else if (ttype->is_typedef()) {
    render_const_value(get_true_type(ttype), tvalue);
  } else if (ttype->is_enum()) {
    f_gen_ << indent() << "{" << endl;
    indent_up();
    f_gen_
      << indent()
      << to_rust_type(ttype)
      << "::try_from("
      << tvalue->get_integer()
      << ").expect(\"expecting valid const value\")"
      << endl;
    indent_down();
    f_gen_ << indent() << "}" << endl;
  } else if (ttype->is_struct() || ttype->is_xception()) {
    render_const_struct(ttype, tvalue);
  } else if (ttype->is_container()) {
    f_gen_ << indent() << "{" << endl;
    indent_up();

    if (ttype->is_list()) {
      render_const_list(ttype, tvalue);
    } else if (ttype->is_set()) {
      render_const_set(ttype, tvalue);
    } else if (ttype->is_map()) {
      render_const_map(ttype, tvalue);
    } else {
      throw "cannot generate const container value for " + ttype->get_name();
    }

    indent_down();
    f_gen_ << indent() << "}" << endl;
  } else {
    throw "cannot generate const value for " + ttype->get_name();
  }
}